

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMRangeImpl::setEnd(DOMRangeImpl *this,DOMNode *refNode,XMLSize_t offset)

{
  DOMDocument *pDVar1;
  int iVar2;
  undefined4 extraout_var;
  DOMException *this_00;
  DOMNode *pDVar3;
  DOMNode *local_48;
  XMLSize_t offset_local;
  DOMNode *refNode_local;
  DOMRangeImpl *this_local;
  
  validateNode(this,refNode);
  checkIndex(this,refNode,offset);
  pDVar1 = this->fDocument;
  iVar2 = (*refNode->_vptr_DOMNode[0xc])();
  if (pDVar1 != (DOMDocument *)CONCAT44(extraout_var,iVar2)) {
    local_48 = (DOMNode *)0x0;
    if (this->fDocument != (DOMDocument *)0x0) {
      local_48 = &this->fDocument->super_DOMNode;
    }
    if (refNode != local_48) {
      (*(this->super_DOMRange)._vptr_DOMRange[0xe])();
      this->fCollapsed = true;
      this_00 = (DOMException *)__cxa_allocate_exception(0x28);
      DOMException::DOMException(this_00,4,0,this->fMemoryManager);
      __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
    }
  }
  this->fEndContainer = refNode;
  this->fEndOffset = offset;
  pDVar3 = commonAncestorOf(this,refNode,this->fStartContainer);
  if (pDVar3 == (DOMNode *)0x0) {
    (*(this->super_DOMRange)._vptr_DOMRange[0xe])(this,0);
  }
  iVar2 = (*(this->super_DOMRange)._vptr_DOMRange[0x11])(this,3);
  if ((short)iVar2 == 1) {
    (*(this->super_DOMRange)._vptr_DOMRange[0xe])(this,0);
  }
  else {
    this->fCollapsed = false;
  }
  return;
}

Assistant:

void DOMRangeImpl::setEnd(const DOMNode* refNode, XMLSize_t offset)
{
    validateNode(refNode);
    checkIndex(refNode, offset);

    // error if not the same owner document
    if (fDocument != refNode->getOwnerDocument()) {
        if ( refNode != fDocument ) {
            collapse(false); //collapse the range positions to end
            fCollapsed = true;
            throw DOMException(
                DOMException::WRONG_DOCUMENT_ERR, 0, fMemoryManager);
        }
    }

    fEndContainer   = (DOMNode*) refNode;
    fEndOffset      = offset;

    // they may be of same document, but not same root container
    // collapse if not the same root container
    if (!commonAncestorOf(refNode, fStartContainer))
        collapse(false);

    //compare the start and end boundary point
    //collapse if start point is after the end point
    if(compareBoundaryPoints(DOMRange::END_TO_START, this) == 1)
        collapse(false); //collapse the range positions to end
    else
        fCollapsed = false;
}